

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identifier.hpp
# Opt level: O2

void __thiscall Centaurus::Identifier::parse(Identifier *this,Stream *stream)

{
  bool bVar1;
  wchar_t wVar2;
  StreamException *__return_storage_ptr__;
  wchar_t *pwVar3;
  Sentry sentry;
  wstring local_40;
  
  sentry._M_current = (stream->m_cur)._M_current;
  wVar2 = Stream::get(stream);
  bVar1 = is_symbol_leader(wVar2);
  if (!bVar1) {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar2);
    __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException)
    ;
  }
  pwVar3 = (stream->m_cur)._M_current;
  if (pwVar3 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length)
  goto LAB_0013c9c7;
  wVar2 = L'\0';
  while (bVar1 = is_symbol_char(wVar2), bVar1) {
    Stream::get(stream);
    pwVar3 = (stream->m_cur)._M_current;
    wVar2 = L'\0';
    if (pwVar3 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
LAB_0013c9c7:
      wVar2 = *pwVar3;
    }
  }
  Stream::cut(&local_40,stream,&sentry);
  std::__cxx11::wstring::operator=((wstring *)&this->m_id,(wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return;
}

Assistant:

void parse(Stream& stream)
    {
        Stream::Sentry sentry = stream.sentry();

        wchar_t ch = stream.get();
        if (!is_symbol_leader(ch))
        {
            throw stream.unexpected(ch);
        }

        ch = stream.peek();
        for (; is_symbol_char(ch); ch = stream.peek())
        {
            stream.discard();
        }

        m_id = stream.cut(sentry);
    }